

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkDecFromTruth(word *pTruth,int nVars,int nLutSize)

{
  int iVar1;
  Vec_Int_t *vCover;
  int *piVar2;
  Abc_Ntk_t *pNtk;
  char *pSop;
  Abc_Ntk_t *pNtkInit;
  Abc_Ntk_t *pNtk_00;
  
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  piVar2 = (int *)malloc(0x40000);
  vCover->pArray = piVar2;
  pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pSop = Abc_SopCreateFromTruthIsop((Mem_Flex_t *)pNtk->pManFunc,nVars,pTruth,vCover);
  pNtkInit = Abc_NtkCreateWithNode(pSop);
  pNtk_00 = Abc_NtkLutmin(pNtkInit,nLutSize,0);
  Abc_NtkDelete(pNtk);
  Abc_NtkDelete(pNtkInit);
  if (vCover->pArray != (int *)0x0) {
    free(vCover->pArray);
    vCover->pArray = (int *)0x0;
  }
  free(vCover);
  iVar1 = Abc_NtkToAig(pNtk_00);
  if (iVar1 == 0) {
    Abc_NtkDelete(pNtk_00);
    fwrite("Converting to AIG has failed.\n",0x1e,1,_stdout);
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  else if (pNtk_00->ntkFunc != ABC_FUNC_AIG) {
    __assert_fail("Abc_NtkHasAig(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkCore.c"
                  ,0x40,"Abc_Ntk_t *Abc_NtkDecFromTruth(word *, int, int)");
  }
  return pNtk_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns decomposed network.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Ntk_t * Abc_NtkDecFromTruth( word * pTruth, int nVars, int nLutSize )
{
    extern Abc_Ntk_t * Abc_NtkLutmin( Abc_Ntk_t * pNtk, int nLutSize, int fVerbose );
    Vec_Int_t * vCover = Vec_IntAlloc( 1 << 16 );
    Abc_Ntk_t * pTemp = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    char * pSopCover = Abc_SopCreateFromTruthIsop( (Mem_Flex_t *)pTemp->pManFunc, nVars, pTruth, vCover );
    Abc_Ntk_t * pNtk = Abc_NtkCreateWithNode( pSopCover );
    Abc_Ntk_t * pNew = Abc_NtkLutmin( pNtk, nLutSize, 0 );
    Abc_NtkDelete( pTemp );
    Abc_NtkDelete( pNtk );
    Vec_IntFree( vCover );
    if ( !Abc_NtkToAig(pNew) )
    {
        Abc_NtkDelete( pNew );
        fprintf( stdout, "Converting to AIG has failed.\n" );
        return NULL;
    }
    assert( Abc_NtkHasAig(pNew) );
    return pNew;
}